

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calendar.cpp
# Opt level: O1

void __thiscall icu_63::Calendar::recalculateStamp(Calendar *this)

{
  int iVar1;
  int iVar2;
  ulong uVar3;
  int iVar4;
  ulong uVar5;
  
  this->fNextStamp = 1;
  iVar2 = 0;
  do {
    uVar3 = 0xffffffff;
    iVar4 = 10000;
    uVar5 = 0;
    do {
      iVar1 = this->fStamp[uVar5];
      if (this->fNextStamp < iVar1 && iVar1 < iVar4) {
        uVar3 = uVar5 & 0xffffffff;
        iVar4 = iVar1;
      }
      uVar5 = uVar5 + 1;
    } while (uVar5 != 0x17);
    if ((int)uVar3 < 0) break;
    iVar4 = this->fNextStamp + 1;
    this->fNextStamp = iVar4;
    this->fStamp[uVar3] = iVar4;
    iVar2 = iVar2 + 1;
  } while (iVar2 != 0x17);
  this->fNextStamp = this->fNextStamp + 1;
  return;
}

Assistant:

void
Calendar::recalculateStamp() {
    int32_t index;
    int32_t currentValue;
    int32_t j, i;

    fNextStamp = 1;

    for (j = 0; j < UCAL_FIELD_COUNT; j++) {
        currentValue = STAMP_MAX;
        index = -1;
        for (i = 0; i < UCAL_FIELD_COUNT; i++) {
            if (fStamp[i] > fNextStamp && fStamp[i] < currentValue) {
                currentValue = fStamp[i];
                index = i;
            }
        }

        if (index >= 0) {
            fStamp[index] = ++fNextStamp;
        } else {
            break;
        }
    }
    fNextStamp++;
}